

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_SIZE_T
opj_stream_read_data
          (opj_stream_private_t *p_stream,OPJ_BYTE *p_buffer,OPJ_SIZE_T p_size,
          opj_event_mgr_t *p_event_mgr)

{
  OPJ_SIZE_T OVar1;
  OPJ_SIZE_T OVar2;
  OPJ_SIZE_T OVar3;
  OPJ_SIZE_T local_50;
  OPJ_SIZE_T local_48;
  opj_stream_private_t *local_40;
  OPJ_SIZE_T local_38;
  OPJ_SIZE_T l_read_nb_bytes;
  opj_event_mgr_t *p_event_mgr_local;
  OPJ_SIZE_T p_size_local;
  OPJ_BYTE *p_buffer_local;
  opj_stream_private_t *p_stream_local;
  
  local_38 = 0;
  if (p_stream->m_bytes_in_buffer < p_size) {
    if ((p_stream->m_status & 4) == 0) {
      if (p_stream->m_bytes_in_buffer == 0) {
        p_stream->m_current_data = p_stream->m_stored_data;
        p_event_mgr_local = (opj_event_mgr_t *)p_size;
        p_size_local = (OPJ_SIZE_T)p_buffer;
      }
      else {
        local_38 = p_stream->m_bytes_in_buffer;
        memcpy(p_buffer,p_stream->m_current_data,p_stream->m_bytes_in_buffer);
        p_stream->m_current_data = p_stream->m_stored_data;
        p_size_local = (OPJ_SIZE_T)(p_buffer + p_stream->m_bytes_in_buffer);
        p_event_mgr_local = (opj_event_mgr_t *)(p_size - p_stream->m_bytes_in_buffer);
        p_stream->m_byte_offset = p_stream->m_bytes_in_buffer + p_stream->m_byte_offset;
        p_stream->m_bytes_in_buffer = 0;
      }
      do {
        if (p_event_mgr_local < (opj_event_mgr_t *)p_stream->m_buffer_size) {
          OVar3 = (*p_stream->m_read_fn)
                            (p_stream->m_stored_data,p_stream->m_buffer_size,p_stream->m_user_data);
          p_stream->m_bytes_in_buffer = OVar3;
          if (p_stream->m_bytes_in_buffer == 0xffffffffffffffff) {
            opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
            p_stream->m_bytes_in_buffer = 0;
            p_stream->m_status = p_stream->m_status | 4;
            if (local_38 == 0) {
              local_48 = 0xffffffffffffffff;
            }
            else {
              local_48 = local_38;
            }
            return local_48;
          }
          if (p_event_mgr_local <= (opj_event_mgr_t *)p_stream->m_bytes_in_buffer) {
            memcpy((void *)p_size_local,p_stream->m_current_data,(size_t)p_event_mgr_local);
            p_stream->m_current_data =
                 p_stream->m_current_data + (long)&p_event_mgr_local->m_error_data;
            p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer - (long)p_event_mgr_local;
            p_stream->m_byte_offset =
                 (long)&p_event_mgr_local->m_error_data + p_stream->m_byte_offset;
            return local_38 + (long)&p_event_mgr_local->m_error_data;
          }
          OVar3 = p_stream->m_bytes_in_buffer;
          memcpy((void *)p_size_local,p_stream->m_current_data,p_stream->m_bytes_in_buffer);
          p_stream->m_current_data = p_stream->m_stored_data;
          OVar1 = p_stream->m_bytes_in_buffer;
          OVar2 = p_stream->m_bytes_in_buffer;
          p_stream->m_byte_offset = p_stream->m_bytes_in_buffer + p_stream->m_byte_offset;
          p_stream->m_bytes_in_buffer = 0;
        }
        else {
          OVar3 = (*p_stream->m_read_fn)
                            ((void *)p_size_local,(OPJ_SIZE_T)p_event_mgr_local,
                             p_stream->m_user_data);
          p_stream->m_bytes_in_buffer = OVar3;
          if (p_stream->m_bytes_in_buffer == 0xffffffffffffffff) {
            opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
            p_stream->m_bytes_in_buffer = 0;
            p_stream->m_status = p_stream->m_status | 4;
            if (local_38 == 0) {
              local_50 = 0xffffffffffffffff;
            }
            else {
              local_50 = local_38;
            }
            return local_50;
          }
          if (p_event_mgr_local <= (opj_event_mgr_t *)p_stream->m_bytes_in_buffer) {
            OVar3 = p_stream->m_bytes_in_buffer;
            p_stream->m_byte_offset = p_stream->m_bytes_in_buffer + p_stream->m_byte_offset;
            p_stream->m_current_data = p_stream->m_stored_data;
            p_stream->m_bytes_in_buffer = 0;
            return local_38 + OVar3;
          }
          OVar3 = p_stream->m_bytes_in_buffer;
          p_stream->m_current_data = p_stream->m_stored_data;
          OVar1 = p_stream->m_bytes_in_buffer;
          OVar2 = p_stream->m_bytes_in_buffer;
          p_stream->m_byte_offset = p_stream->m_bytes_in_buffer + p_stream->m_byte_offset;
          p_stream->m_bytes_in_buffer = 0;
        }
        p_size_local = OVar1 + p_size_local;
        p_event_mgr_local = (opj_event_mgr_t *)((long)p_event_mgr_local - OVar2);
        local_38 = local_38 + OVar3;
      } while( true );
    }
    local_40 = (opj_stream_private_t *)p_stream->m_bytes_in_buffer;
    memcpy(p_buffer,p_stream->m_current_data,p_stream->m_bytes_in_buffer);
    p_stream->m_current_data = p_stream->m_current_data + p_stream->m_bytes_in_buffer;
    p_stream->m_byte_offset = p_stream->m_bytes_in_buffer + p_stream->m_byte_offset;
    p_stream->m_bytes_in_buffer = 0;
    if (local_40 == (opj_stream_private_t *)0x0) {
      local_40 = (opj_stream_private_t *)0xffffffffffffffff;
    }
    p_stream_local = local_40;
  }
  else {
    memcpy(p_buffer,p_stream->m_current_data,p_size);
    p_stream->m_current_data = p_stream->m_current_data + p_size;
    p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer - p_size;
    p_stream->m_byte_offset = p_size + p_stream->m_byte_offset;
    p_stream_local = (opj_stream_private_t *)p_size;
  }
  return (OPJ_SIZE_T)p_stream_local;
}

Assistant:

OPJ_SIZE_T opj_stream_read_data (opj_stream_private_t * p_stream,OPJ_BYTE * p_buffer, OPJ_SIZE_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_SIZE_T l_read_nb_bytes = 0;
	if (p_stream->m_bytes_in_buffer >= p_size) {
		memcpy(p_buffer,p_stream->m_current_data,p_size);
		p_stream->m_current_data += p_size;
		p_stream->m_bytes_in_buffer -= p_size;
		l_read_nb_bytes += p_size;
		p_stream->m_byte_offset += (OPJ_OFF_T)p_size;
		return l_read_nb_bytes;
	}

	/* we are now in the case when the remaining data if not sufficient */
	if (p_stream->m_status & OPJ_STREAM_STATUS_END) {
		l_read_nb_bytes += p_stream->m_bytes_in_buffer;
		memcpy(p_buffer,p_stream->m_current_data,p_stream->m_bytes_in_buffer);
		p_stream->m_current_data += p_stream->m_bytes_in_buffer;
		p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
		p_stream->m_bytes_in_buffer = 0;
		return l_read_nb_bytes ? l_read_nb_bytes : (OPJ_SIZE_T)-1;
	}

	/* the flag is not set, we copy data and then do an actual read on the stream */
	if (p_stream->m_bytes_in_buffer) {
		l_read_nb_bytes += p_stream->m_bytes_in_buffer;
		memcpy(p_buffer,p_stream->m_current_data,p_stream->m_bytes_in_buffer);
		p_stream->m_current_data = p_stream->m_stored_data;
		p_buffer += p_stream->m_bytes_in_buffer;
		p_size -= p_stream->m_bytes_in_buffer;
		p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
		p_stream->m_bytes_in_buffer = 0;
	}
	else {
    /* case where we are already at the end of the buffer
       so reset the m_current_data to point to the start of the
       stored buffer to get ready to read from disk*/
		p_stream->m_current_data = p_stream->m_stored_data;
	}

	for (;;) {
		/* we should read less than a chunk -> read a chunk */
		if (p_size < p_stream->m_buffer_size) {
			/* we should do an actual read on the media */
			p_stream->m_bytes_in_buffer = p_stream->m_read_fn(p_stream->m_stored_data,p_stream->m_buffer_size,p_stream->m_user_data);

			if (p_stream->m_bytes_in_buffer == (OPJ_SIZE_T)-1) {
				/* end of stream */
				opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

				p_stream->m_bytes_in_buffer = 0;
				p_stream->m_status |= OPJ_STREAM_STATUS_END;
				/* end of stream */
				return l_read_nb_bytes ? l_read_nb_bytes : (OPJ_SIZE_T)-1;
			}
			else if	(p_stream->m_bytes_in_buffer < p_size) {
				/* not enough data */
				l_read_nb_bytes += p_stream->m_bytes_in_buffer;
				memcpy(p_buffer,p_stream->m_current_data,p_stream->m_bytes_in_buffer);
				p_stream->m_current_data = p_stream->m_stored_data;
				p_buffer += p_stream->m_bytes_in_buffer;
				p_size -= p_stream->m_bytes_in_buffer;
				p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
				p_stream->m_bytes_in_buffer = 0;
			}
			else {
				l_read_nb_bytes += p_size;
				memcpy(p_buffer,p_stream->m_current_data,p_size);
				p_stream->m_current_data += p_size;
				p_stream->m_bytes_in_buffer -= p_size;
				p_stream->m_byte_offset += (OPJ_OFF_T)p_size;
				return l_read_nb_bytes;
			}
		}
		else {
			/* direct read on the dest buffer */
			p_stream->m_bytes_in_buffer = p_stream->m_read_fn(p_buffer,p_size,p_stream->m_user_data);

			if (p_stream->m_bytes_in_buffer == (OPJ_SIZE_T)-1) {
				/*  end of stream */
				opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

				p_stream->m_bytes_in_buffer = 0;
				p_stream->m_status |= OPJ_STREAM_STATUS_END;
				/* end of stream */
				return l_read_nb_bytes ? l_read_nb_bytes : (OPJ_SIZE_T)-1;
			}
			else if (p_stream->m_bytes_in_buffer < p_size) {
				/* not enough data */
				l_read_nb_bytes += p_stream->m_bytes_in_buffer;
				p_stream->m_current_data = p_stream->m_stored_data;
				p_buffer += p_stream->m_bytes_in_buffer;
				p_size -= p_stream->m_bytes_in_buffer;
				p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
				p_stream->m_bytes_in_buffer = 0;
			}
			else {
				/* we have read the exact size */
				l_read_nb_bytes += p_stream->m_bytes_in_buffer;
				p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
				p_stream->m_current_data = p_stream->m_stored_data;
				p_stream->m_bytes_in_buffer = 0;
				return l_read_nb_bytes;
			}
		}
	}
}